

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O0

double tu_product(int i,int j,double x)

{
  double dVar1;
  double dVar2;
  undefined8 local_20;
  double value;
  double x_local;
  int j_local;
  int i_local;
  
  if (i < 0) {
    local_20 = 0.0;
  }
  else if (j < 0) {
    local_20 = 0.0;
  }
  else if (i == 0) {
    local_20 = u_polynomial_value(j,x);
  }
  else {
    dVar1 = uu_product(i,j,x);
    dVar2 = uu_product(i + -2,j,x);
    local_20 = (dVar1 - dVar2) * 0.5;
  }
  return local_20;
}

Assistant:

double tu_product ( int i, int j, double x )

//****************************************************************************80
//
//  Purpose:
//
//    TU_PRODUCT: evaluate T(i,x)*U(j,x)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    13 July 2015
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int I, J, the indices.
//
//    Input, double X, the argument.
//
//    Output, double TU_PRODUCT, the value.
//
{
  double value;

  if ( i < 0 )
  {
    value = 0.0;
  }
  else if ( j < 0 )
  {
    value = 0.0;
  }
  else if ( i == 0 )
  {
    value = u_polynomial_value ( j, x );
  }
  else
  {
    value = 0.5 * ( uu_product ( i, j, x ) - uu_product ( i - 2, j, x ) );
  }

  return value;
}